

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-cardinalities.cc
# Opt level: O2

void testing::Cardinality::DescribeActualCallCountTo(int actual_call_count,ostream *os)

{
  ostream *poVar1;
  int n;
  string sStack_38;
  
  if (0 < actual_call_count) {
    poVar1 = std::operator<<(os,"called ");
    testing::(anonymous_namespace)::FormatTimes_abi_cxx11_
              (&sStack_38,(_anonymous_namespace_ *)(ulong)(uint)actual_call_count,n);
    std::operator<<(poVar1,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    return;
  }
  std::operator<<(os,"never called");
  return;
}

Assistant:

void Cardinality::DescribeActualCallCountTo(int actual_call_count,
                                            ::std::ostream* os) {
  if (actual_call_count > 0) {
    *os << "called " << FormatTimes(actual_call_count);
  } else {
    *os << "never called";
  }
}